

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::~MessageGenerator(MessageGenerator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
  ::~scoped_array(&this->extension_generators_);
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
  ::~scoped_array(&this->enum_generators_);
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::~scoped_array(&this->nested_generators_);
  FieldGeneratorMap::~FieldGeneratorMap(&this->field_generators_);
  pcVar1 = (this->options_).dllexport_decl._M_dataplus._M_p;
  paVar2 = &(this->options_).dllexport_decl.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->classname_)._M_dataplus._M_p;
  paVar2 = &(this->classname_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

MessageGenerator::~MessageGenerator() {}